

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O3

void __thiscall pg::PSISolver::compute_vals_seq(PSISolver *this)

{
  void *pvVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  vector<int,_std::allocator<int>_> q;
  int local_4c;
  int *local_48;
  iterator iStack_40;
  int *local_38;
  
  local_38 = (int *)0x0;
  local_48 = (int *)0x0;
  iStack_40._M_current = (int *)0x0;
  memset(first_in,0xff,((this->super_Solver).game)->n_vertices << 2);
  local_4c = 0;
  lVar7 = ((this->super_Solver).game)->n_vertices;
  if (0 < lVar7) {
    lVar5 = 0;
    do {
      pvVar1 = first_in;
      lVar4 = done;
      if (*(int *)(done + lVar5 * 4) != 3) {
        lVar6 = (long)*(int *)(str + lVar5 * 4);
        if ((lVar6 == -1) || (*(int *)(halt + lVar6 * 4) != 0)) {
          if (iStack_40._M_current == local_38) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_48,iStack_40,&local_4c);
            lVar7 = ((this->super_Solver).game)->n_vertices;
          }
          else {
            *iStack_40._M_current = (int)lVar5;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
        else {
          *(undefined4 *)(next_in + lVar5 * 4) = *(undefined4 *)((long)first_in + lVar6 * 4);
          *(int *)((long)pvVar1 + lVar6 * 4) = local_4c;
          if (*(int *)(lVar4 + (long)local_4c * 4) != 2) {
            *(undefined4 *)(lVar4 + (long)local_4c * 4) = 2;
          }
        }
      }
      lVar5 = (long)local_4c + 1;
      local_4c = (int)lVar5;
    } while (lVar5 < lVar7);
    if (local_48 != iStack_40._M_current) {
      iVar3 = local_4c;
      do {
        local_4c = iVar3;
        lVar7 = (long)iStack_40._M_current[-1];
        iStack_40._M_current = iStack_40._M_current + -1;
        pvVar1 = (void *)(val + (int)k * lVar7 * 4);
        iVar3 = *(int *)(str + lVar7 * 4);
        if (((long)iVar3 == -1) || (*(int *)(halt + (long)iVar3 * 4) != 0)) {
          memset(pvVar1,0,(ulong)k << 2);
        }
        else {
          memcpy(pvVar1,(void *)(val + (long)(int)(iVar3 * k) * 4),(ulong)k << 2);
        }
        piVar2 = (int *)((long)pvVar1 + (long)((this->super_Solver).game)->_priority[lVar7] * 4);
        *piVar2 = *piVar2 + 1;
        *(undefined4 *)(done + lVar7 * 4) = 1;
        for (local_4c = *(int *)((long)first_in + lVar7 * 4); local_4c != -1;
            local_4c = *(int *)(next_in + (long)local_4c * 4)) {
          if (iStack_40._M_current == local_38) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_48,iStack_40,&local_4c);
          }
          else {
            *iStack_40._M_current = local_4c;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
        local_4c = -1;
        iVar3 = -1;
      } while (local_48 != iStack_40._M_current);
    }
    if (local_48 != (int *)0x0) {
      operator_delete(local_48,(long)local_38 - (long)local_48);
    }
  }
  return;
}

Assistant:

void
PSISolver::compute_vals_seq(void)
{
    std::vector<int> q;

    memset(first_in, -1, sizeof(int[nodecount()]));

    for (int n=0; n<nodecount(); n++) {
        if (done[n] == 3) continue; // disabled
        int s = str[n];
        if (s == -1 or halt[s]) { // either we halt or the dummy halts...
            // assuming that valuation is properly initialized...
            q.push_back(n);
        } else {
            next_in[n] = first_in[s];
            first_in[s] = n;
            if (done[n] != 2) done[n] = 2; // mark "2", if not updated, then it's on a cycle
        }
    }

    while (!q.empty()) {
        int v = q.back();
        q.pop_back();

        // set valuation
        int *val_v = val + k*v;
        int s = str[v];
        if (s == -1 or halt[s]) memset(val_v, 0, sizeof(int[k]));
        else memcpy(val_v, val+k*s, sizeof(int[k]));
        val_v[priority(v)]++;
        done[v] = 1; // mark "1" as processed and not on a cycle

        // add predecessors
        int from = first_in[v];
        while (from != -1) {
            q.push_back(from);
            from = next_in[from];
        }
    }
}